

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)1>(ViewTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  int iVar2;
  undefined8 uVar3;
  value_type *__val;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  reference piVar5;
  size_t sVar6;
  size_t sVar7;
  logic_error *plVar8;
  code *pcVar9;
  size_t sVar10;
  undefined *puVar11;
  size_t args;
  int *piVar12;
  size_t sVar13;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  View<int,_true,_std::allocator<unsigned_long>_> w6;
  View<int,_true,_std::allocator<unsigned_long>_> w5;
  View<int,_true,_std::allocator<unsigned_long>_> w4;
  View<int,_true,_std::allocator<unsigned_long>_> w3;
  View<int,_true,_std::allocator<unsigned_long>_> w2;
  View<int,_true,_std::allocator<unsigned_long>_> w1;
  View<int,_true,_std::allocator<unsigned_long>_> w7;
  View<int,_true,_std::allocator<unsigned_long>_> w8;
  allocator_type local_281;
  undefined1 local_280 [16];
  size_t *local_270;
  size_t local_258;
  CoordinateOrder local_23c;
  undefined1 local_238 [16];
  size_t *local_228;
  size_t local_210;
  undefined1 local_1f8 [16];
  size_t *local_1e8;
  size_t local_1d0;
  undefined1 local_1b8 [16];
  size_t *local_1a8;
  size_t local_190;
  undefined1 local_178 [16];
  size_t *local_168;
  size_t local_150;
  undefined1 local_138 [16];
  size_t *local_128;
  size_t local_110;
  undefined1 local_f8 [16];
  size_t *local_e8;
  size_t local_d0;
  undefined1 local_b8 [16];
  size_t *local_a8;
  size_t local_90;
  undefined1 local_78 [16];
  size_t *local_68;
  size_t local_50;
  int *local_38;
  
  _Var4._M_current = (unsigned_long *)operator_new(0x10);
  _Var1._M_current = _Var4._M_current + 2;
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 0;
  *_Var4._M_current = 6;
  _Var4._M_current[1] = 4;
  piVar12 = this->data_;
  local_f8._0_4_ = 1;
  local_280._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_280 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_f8,&andres::defaultOrder,(allocator_type *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
  local_138._0_4_ = 1;
  local_f8._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_138,&andres::defaultOrder,(allocator_type *)local_178);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_178._0_4_ = 1;
  local_138._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_178,&andres::defaultOrder,(allocator_type *)local_1b8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  local_1b8._0_4_ = 1;
  local_178._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_178 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_1b8,&andres::defaultOrder,(allocator_type *)local_1f8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_178);
  local_1f8._0_4_ = 1;
  local_1b8._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1b8 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_1f8,&andres::defaultOrder,(allocator_type *)local_238);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8);
  local_238._0_4_ = 1;
  local_1f8._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1f8 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_238,&andres::defaultOrder,(allocator_type *)local_b8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1f8);
  local_b8._0_4_ = 1;
  local_238._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_238 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_b8,&andres::defaultOrder,(allocator_type *)local_78);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_238);
  local_38 = piVar12;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_178,3);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8,-1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1f8,-2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_238,-3);
  sVar13 = 0;
  do {
    sVar10 = 0;
    do {
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_280,sVar13,sVar10);
      iVar2 = *piVar5;
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_f8,sVar10,sVar13);
      if (iVar2 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_280,sVar13,sVar10);
      iVar2 = *piVar5;
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_138,sVar13,sVar10);
      if (iVar2 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_280,sVar13,sVar10);
      iVar2 = *piVar5;
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_178,sVar10,sVar13);
      if (iVar2 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_280,sVar13,sVar10);
      iVar2 = *piVar5;
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_1b8,sVar10,sVar13);
      if (iVar2 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_280,sVar13,sVar10);
      iVar2 = *piVar5;
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_1f8,sVar13,sVar10);
      if (iVar2 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_280,sVar13,sVar10);
      iVar2 = *piVar5;
      piVar5 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_238,sVar10,sVar13);
      if (iVar2 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != 4);
    sVar13 = sVar13 + 1;
  } while (sVar13 != 6);
  operator_delete(local_228,local_210 * 0x18);
  operator_delete(local_1e8,local_1d0 * 0x18);
  operator_delete(local_1a8,local_190 * 0x18);
  operator_delete(local_168,local_150 * 0x18);
  operator_delete(local_128,local_110 * 0x18);
  operator_delete(local_e8,local_d0 * 0x18);
  operator_delete(local_270,local_258 * 0x18);
  operator_delete(_Var4._M_current,0x10);
  _Var4._M_current = (unsigned_long *)operator_new(0x18);
  piVar12 = local_38;
  _Var1._M_current = _Var4._M_current + 3;
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 0;
  *_Var4._M_current = 3;
  _Var4._M_current[1] = 4;
  _Var4._M_current[2] = 2;
  local_f8._0_4_ = 1;
  local_280._0_8_ = local_38;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_280 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_f8,&andres::defaultOrder,(allocator_type *)local_138);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
  local_138._0_4_ = 1;
  local_f8._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f8 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_138,&andres::defaultOrder,(allocator_type *)local_178);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
  local_178._0_4_ = 1;
  local_138._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_138 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_178,&andres::defaultOrder,(allocator_type *)local_1b8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  local_1b8._0_4_ = 1;
  local_178._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_178 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_1b8,&andres::defaultOrder,(allocator_type *)local_1f8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_178);
  local_1f8._0_4_ = 1;
  local_1b8._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1b8 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_1f8,&andres::defaultOrder,(allocator_type *)local_238);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8);
  local_238._0_4_ = 1;
  local_1f8._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1f8 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_238,&andres::defaultOrder,(allocator_type *)local_b8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1f8);
  local_b8._0_4_ = 1;
  local_238._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_238 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_b8,&andres::defaultOrder,(allocator_type *)local_78);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_238);
  local_78._0_4_ = 1;
  local_b8._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b8 + 8),_Var4,_Var1,
             (CoordinateOrder *)local_78,&andres::defaultOrder,(allocator_type *)&local_23c);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b8);
  local_23c = LastMajorOrder;
  local_78._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_78 + 8),_Var4,_Var1,&local_23c,
             &andres::defaultOrder,&local_281);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_178,3);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8,4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1f8,-1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_238,-2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b8,-3);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,-4);
  sVar13 = 0;
  do {
    sVar10 = 0;
    do {
      args = 0;
      do {
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
        uVar3 = local_280._0_8_;
        if (((int *)local_280._0_8_ == (int *)0x0) || (local_258 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001b19f1:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001b19ff:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,3,sVar10,
                           args);
        iVar2 = *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8);
        uVar3 = local_f8._0_8_;
        if (((int *)local_f8._0_8_ == (int *)0x0) || (local_d0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001b19f1;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_f8,3,sVar13,
                           sVar10);
        if (iVar2 != *(int *)(uVar3 + (sVar6 * args + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001b19ff;
        }
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
        uVar3 = local_280._0_8_;
        if (((int *)local_280._0_8_ == (int *)0x0) || (local_258 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001b19a4:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001b1bc6:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,3,sVar10,
                           args);
        iVar2 = *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
        uVar3 = local_138._0_8_;
        if (((int *)local_138._0_8_ == (int *)0x0) || (local_110 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001b19a4;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138,3,args,
                           sVar13);
        if (iVar2 != *(int *)(uVar3 + (sVar6 * sVar10 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001b1bc6;
        }
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
        uVar3 = local_280._0_8_;
        if (((int *)local_280._0_8_ == (int *)0x0) || (local_258 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001b1b86:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001b1b94:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,3,sVar10,
                           args);
        iVar2 = *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_178);
        uVar3 = local_178._0_8_;
        if (((int *)local_178._0_8_ == (int *)0x0) || (local_150 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001b1b86;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_178,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_178,3,sVar10,
                           args);
        if (iVar2 != *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001b1b94;
        }
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
        uVar3 = local_280._0_8_;
        if (((int *)local_280._0_8_ == (int *)0x0) || (local_258 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001b1b0a:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001b1b18:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,3,sVar10,
                           args);
        iVar2 = *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8);
        uVar3 = local_1b8._0_8_;
        if (((int *)local_1b8._0_8_ == (int *)0x0) || (local_190 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001b1b0a;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1b8,3,sVar13,
                           sVar10);
        if (iVar2 != *(int *)(uVar3 + (sVar6 * args + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001b1b18;
        }
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
        uVar3 = local_280._0_8_;
        if (((int *)local_280._0_8_ == (int *)0x0) || (local_258 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001b1a62:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001b1ac8:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,3,sVar10,
                           args);
        iVar2 = *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1f8);
        uVar3 = local_1f8._0_8_;
        if (((int *)local_1f8._0_8_ == (int *)0x0) || (local_1d0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001b1a62;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1f8,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1f8,3,args,
                           sVar13);
        if (iVar2 != *(int *)(uVar3 + (sVar6 * sVar10 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001b1ac8;
        }
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
        uVar3 = local_280._0_8_;
        if (((int *)local_280._0_8_ == (int *)0x0) || (local_258 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001b1cdf:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001b1ced:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,3,sVar10,
                           args);
        iVar2 = *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_238);
        uVar3 = local_238._0_8_;
        if (((int *)local_238._0_8_ == (int *)0x0) || (local_210 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001b1cdf;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_238,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_238,3,sVar13,
                           sVar10);
        if (iVar2 != *(int *)(uVar3 + (sVar6 * args + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001b1ced;
        }
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
        uVar3 = local_280._0_8_;
        if (((int *)local_280._0_8_ == (int *)0x0) || (local_258 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001b1c55:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001b1c63:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,3,sVar10,
                           args);
        iVar2 = *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b8);
        uVar3 = local_b8._0_8_;
        if (((int *)local_b8._0_8_ == (int *)0x0) || (local_90 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001b1c55;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b8,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_b8,3,sVar10,args
                          );
        if (iVar2 != *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001b1c63;
        }
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280);
        uVar3 = local_280._0_8_;
        if (((int *)local_280._0_8_ == (int *)0x0) || (local_258 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001b1cb3:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001b1d1f:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_280,3,sVar10,
                           args);
        iVar2 = *(int *)(uVar3 + (sVar6 * sVar13 + sVar7) * 4);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78);
        uVar3 = local_78._0_8_;
        if (((int *)local_78._0_8_ == (int *)0x0) || (local_50 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001b1cb3;
        }
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,0);
        sVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_78,3,args,sVar13
                          );
        if (iVar2 != *(int *)(uVar3 + (sVar6 * sVar10 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001b1d1f;
        }
        args = args + 1;
      } while (args == 1);
      sVar10 = sVar10 + 1;
    } while (sVar10 != 4);
    sVar13 = sVar13 + 1;
    if (sVar13 == 3) {
      operator_delete(local_68,local_50 * 0x18);
      operator_delete(local_a8,local_90 * 0x18);
      operator_delete(local_228,local_210 * 0x18);
      operator_delete(local_1e8,local_1d0 * 0x18);
      operator_delete(local_1a8,local_190 * 0x18);
      operator_delete(local_168,local_150 * 0x18);
      operator_delete(local_128,local_110 * 0x18);
      operator_delete(local_e8,local_d0 * 0x18);
      operator_delete(local_270,local_258 * 0x18);
      operator_delete(_Var4._M_current,0x18);
      return;
    }
  } while( true );
}

Assistant:

void ViewTest::shiftOperatorTest() {
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w6(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        w1.shift(1);
        w2.shift(2);
        w3.shift(3);
        w4.shift(-1);
        w5.shift(-2);
        w6.shift(-3);

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
                test(v(x, y) == w3(y, x));
                test(v(x, y) == w4(y, x));
                test(v(x, y) == w5(x, y));
                test(v(x, y) == w6(y, x));
            }
        }
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3; 
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w6(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w7(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w8(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        w1.shift(1);
        w2.shift(2);
        w3.shift(3);
        w4.shift(4);
        w5.shift(-1);
        w6.shift(-2);
        w7.shift(-3);
        w8.shift(-4);

        for(std::size_t x=0; x<3; ++x) {
            for(std::size_t y=0; y<4; ++y) {

                for(std::size_t z=0; z<2; ++z) {
                    test(v(x, y, z) == w1(z, x, y));
                    test(v(x, y, z) == w2(y, z, x));
                    test(v(x, y, z) == w3(x, y, z));
                    test(v(x, y, z) == w4(z, x, y));
                    test(v(x, y, z) == w5(y, z, x));
                    test(v(x, y, z) == w6(z, x, y));
                    test(v(x, y, z) == w7(x, y, z));
                    test(v(x, y, z) == w8(y, z, x));
                }
            }
        }
    }
}